

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O3

void * coll_seq_prepend(coll_seq_t *seq,void *data)

{
  coll_seq_node_t *pcVar1;
  
  if (seq == (coll_seq_t *)0x0) {
    data = (void *)0x0;
  }
  else {
    pcVar1 = (coll_seq_node_t *)malloc(0x10);
    pcVar1->data = data;
    pcVar1->next = seq->head;
    seq->head = pcVar1;
    seq->len = seq->len + 1;
  }
  return data;
}

Assistant:

void *coll_seq_prepend(coll_seq_t *seq, void *data) {
    if (!seq) {
        return NULL;
    }
    node_t *node = malloc(sizeof(node_t));
    node->data = data;
    node->next = seq->head;
    seq->head = node;
    ++(seq->len);
    return data;
}